

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_synth.cpp
# Opt level: O3

VkRenderPass
synthesize_render_pass
          (StateRecorder *recorder,spvc_compiler frag,uint32_t view_count,uint8_t *active_rt_mask)

{
  VkFormat *pVVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  spvc_bool sVar4;
  byte bVar5;
  bool bVar6;
  spvc_result sVar7;
  uint uVar8;
  SpvId SVar9;
  spvc_basetype sVar10;
  spvc_type psVar11;
  ulong uVar12;
  long lVar13;
  uint32_t uVar14;
  VkFormat VVar15;
  VkImageLayout VVar16;
  ulong uVar17;
  ulong uVar18;
  ulong uVar19;
  size_t count;
  spvc_reflected_resource *list;
  spvc_resources resources;
  VkFormat input_rt_formats [8];
  VkFormat rt_formats [8];
  uint input_location_to_attachment [8];
  uint output_location_to_attachment [8];
  VkAttachmentDescription2 attachments [8];
  VkAttachmentReference2 input_references [8];
  VkAttachmentReference2 references [8];
  ulong local_550;
  spvc_reflected_resource *local_548;
  uint32_t local_53c;
  spvc_resources local_538;
  StateRecorder *local_530;
  VkFormat local_528 [32];
  VkRenderPassCreateInfo2 local_4a8;
  VkSubpassDescription2 local_458;
  VkAttachmentDescription2 local_3f8 [8];
  VkAttachmentReference2 local_238 [8];
  VkAttachmentReference2 local_138 [8];
  
  sVar7 = spvc_compiler_create_shader_resources(frag,&local_538);
  if (sVar7 == SPVC_SUCCESS) {
    local_528[0xc] = VK_FORMAT_UNDEFINED;
    local_528[0xd] = VK_FORMAT_UNDEFINED;
    local_528[0xe] = VK_FORMAT_UNDEFINED;
    local_528[0xf] = VK_FORMAT_UNDEFINED;
    local_528[8] = VK_FORMAT_UNDEFINED;
    local_528[9] = VK_FORMAT_UNDEFINED;
    local_528[10] = VK_FORMAT_UNDEFINED;
    local_528[0xb] = VK_FORMAT_UNDEFINED;
    local_528[4] = VK_FORMAT_UNDEFINED;
    local_528[5] = VK_FORMAT_UNDEFINED;
    local_528[6] = VK_FORMAT_UNDEFINED;
    local_528[7] = VK_FORMAT_UNDEFINED;
    local_528[0] = VK_FORMAT_UNDEFINED;
    local_528[1] = VK_FORMAT_UNDEFINED;
    local_528[2] = VK_FORMAT_UNDEFINED;
    local_528[3] = VK_FORMAT_UNDEFINED;
    sVar7 = spvc_resources_get_resource_list_for_type
                      (local_538,SPVC_RESOURCE_TYPE_STAGE_OUTPUT,&local_548,&local_550);
    if (sVar7 == SPVC_SUCCESS) {
      local_53c = view_count;
      local_530 = recorder;
      if (local_550 != 0) {
        uVar19 = 0;
        do {
          psVar11 = spvc_compiler_get_type_handle(frag,local_548[uVar19].type_id);
          uVar8 = spvc_type_get_num_array_dimensions(psVar11);
          uVar17 = 1;
          if (uVar8 == 1) {
            sVar4 = spvc_type_array_dimension_is_literal(psVar11,0);
            if (sVar4 == '\0') {
              return (VkRenderPass)0x0;
            }
            SVar9 = spvc_type_get_array_dimension(psVar11,0);
            uVar17 = (ulong)SVar9;
          }
          uVar8 = spvc_compiler_get_decoration(frag,local_548[uVar19].id,SpvDecorationLocation);
          if (7 < uVar8 + (int)uVar17) {
            synthesize_render_pass();
            return (VkRenderPass)0x0;
          }
          sVar10 = spvc_type_get_basetype(psVar11);
          VVar15 = VK_FORMAT_UNDEFINED;
          if (sVar10 - SPVC_BASETYPE_INT16 < 9) {
            VVar15 = *(VkFormat *)(&DAT_002e2690 + (ulong)(sVar10 - SPVC_BASETYPE_INT16) * 4);
          }
          if ((int)uVar17 != 0) {
            bVar5 = *active_rt_mask;
            do {
              local_528[(ulong)uVar8 + 8] = VVar15;
              bVar5 = bVar5 | (byte)(1 << ((byte)uVar8 & 0x1f));
              uVar8 = uVar8 + 1;
              uVar17 = uVar17 - 1;
            } while (uVar17 != 0);
            *active_rt_mask = bVar5;
          }
          uVar19 = uVar19 + 1;
        } while (uVar19 < local_550);
      }
      sVar7 = spvc_resources_get_resource_list_for_type
                        (local_538,SPVC_RESOURCE_TYPE_SUBPASS_INPUT,&local_548,&local_550);
      if (sVar7 == SPVC_SUCCESS) {
        if (local_550 != 0) {
          uVar19 = 0;
          do {
            psVar11 = spvc_compiler_get_type_handle(frag,local_548[uVar19].type_id);
            uVar8 = spvc_type_get_num_array_dimensions(psVar11);
            uVar17 = 1;
            if (uVar8 == 1) {
              sVar4 = spvc_type_array_dimension_is_literal(psVar11,0);
              if (sVar4 == '\0') {
                return (VkRenderPass)0x0;
              }
              SVar9 = spvc_type_get_array_dimension(psVar11,0);
              uVar17 = (ulong)SVar9;
            }
            uVar8 = spvc_compiler_get_decoration
                              (frag,local_548[uVar19].id,SpvDecorationInputAttachmentIndex);
            if (7 < uVar8 + (int)uVar17) {
              synthesize_render_pass();
              return (VkRenderPass)0x0;
            }
            sVar10 = spvc_type_get_basetype(psVar11);
            VVar15 = VK_FORMAT_UNDEFINED;
            if (sVar10 - SPVC_BASETYPE_INT16 < 9) {
              VVar15 = *(VkFormat *)(&DAT_002e2690 + (ulong)(sVar10 - SPVC_BASETYPE_INT16) * 4);
            }
            if ((int)uVar17 != 0) {
              do {
                local_528[uVar8] = VVar15;
                uVar8 = uVar8 + 1;
                uVar17 = uVar17 - 1;
              } while (uVar17 != 0);
            }
            uVar19 = uVar19 + 1;
          } while (uVar19 < local_550);
        }
        uVar19 = 0;
        uVar17 = 0;
        do {
          lVar13 = uVar19 + 8;
          uVar19 = uVar19 + 1;
          if (local_528[lVar13] != VK_FORMAT_UNDEFINED) {
            uVar17 = uVar19 & 0xffffffff;
          }
        } while (uVar19 != 8);
        uVar19 = 0;
        uVar18 = 0;
        do {
          pVVar1 = local_528 + uVar19;
          uVar19 = uVar19 + 1;
          if (*pVVar1 != VK_FORMAT_UNDEFINED) {
            uVar18 = uVar19 & 0xffffffff;
          }
        } while (uVar19 != 8);
        uVar2 = (uint32_t)uVar17;
        uVar3 = (uint32_t)uVar18;
        if (uVar2 + uVar3 < 9) {
          local_528[0x1c] = VK_FORMAT_UNDEFINED;
          local_528[0x1d] = VK_FORMAT_UNDEFINED;
          local_528[0x1e] = VK_FORMAT_UNDEFINED;
          local_528[0x1f] = VK_FORMAT_UNDEFINED;
          local_528[0x18] = VK_FORMAT_UNDEFINED;
          local_528[0x19] = VK_FORMAT_UNDEFINED;
          local_528[0x1a] = VK_FORMAT_UNDEFINED;
          local_528[0x1b] = VK_FORMAT_UNDEFINED;
          local_528[0x14] = VK_FORMAT_UNDEFINED;
          local_528[0x15] = VK_FORMAT_UNDEFINED;
          local_528[0x16] = VK_FORMAT_UNDEFINED;
          local_528[0x17] = VK_FORMAT_UNDEFINED;
          local_528[0x10] = VK_FORMAT_UNDEFINED;
          local_528[0x11] = VK_FORMAT_UNDEFINED;
          local_528[0x12] = VK_FORMAT_UNDEFINED;
          local_528[0x13] = VK_FORMAT_UNDEFINED;
          local_4a8.pNext = (void *)0x0;
          local_4a8.correlatedViewMaskCount = 0;
          local_4a8._68_4_ = 0;
          local_4a8.pCorrelatedViewMasks = (uint32_t *)0x0;
          local_4a8.dependencyCount = 0;
          local_4a8._52_4_ = 0;
          local_4a8.pDependencies = (VkSubpassDependency2 *)0x0;
          local_4a8.subpassCount = 0;
          local_4a8._36_4_ = 0;
          local_4a8.pSubpasses = (VkSubpassDescription2 *)0x0;
          local_4a8.flags = 0;
          local_4a8.attachmentCount = 0;
          local_4a8.pAttachments = (VkAttachmentDescription2 *)0x0;
          local_4a8.sType = VK_STRUCTURE_TYPE_RENDER_PASS_CREATE_INFO_2;
          local_4a8._4_4_ = 0;
          uVar19 = 0;
          memset(local_3f8,0,0x1c0);
          if (uVar2 != 0) {
            uVar12 = 0;
            uVar19 = 0;
            do {
              VVar15 = local_528[uVar12 + 8];
              if (VVar15 != VK_FORMAT_UNDEFINED) {
                local_3f8[uVar19].sType = VK_STRUCTURE_TYPE_ATTACHMENT_DESCRIPTION_2;
                local_3f8[uVar19].format = VVar15;
                local_3f8[uVar19].samples = VK_SAMPLE_COUNT_1_BIT;
                local_3f8[uVar19].loadOp = VK_ATTACHMENT_LOAD_OP_CLEAR;
                local_3f8[uVar19].storeOp = VK_ATTACHMENT_STORE_OP_STORE;
                local_3f8[uVar19].initialLayout = VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL;
                local_3f8[uVar19].finalLayout = VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL;
                local_528[uVar12 + 0x18] = (VkFormat)uVar19;
                uVar19 = (ulong)((VkFormat)uVar19 + VK_FORMAT_R4G4_UNORM_PACK8);
              }
              uVar12 = uVar12 + 1;
            } while (uVar17 != uVar12);
            local_4a8.attachmentCount = (uint32_t)uVar19;
          }
          if (uVar3 != 0) {
            uVar12 = 0;
            do {
              VVar15 = local_528[uVar12];
              if (VVar15 != VK_FORMAT_UNDEFINED) {
                local_3f8[uVar19].sType = VK_STRUCTURE_TYPE_ATTACHMENT_DESCRIPTION_2;
                local_3f8[uVar19].format = VVar15;
                local_3f8[uVar19].samples = VK_SAMPLE_COUNT_1_BIT;
                local_3f8[uVar19].loadOp = VK_ATTACHMENT_LOAD_OP_LOAD;
                local_3f8[uVar19].storeOp = VK_ATTACHMENT_STORE_OP_STORE;
                local_3f8[uVar19].initialLayout = VK_IMAGE_LAYOUT_SHADER_READ_ONLY_OPTIMAL;
                local_3f8[uVar19].finalLayout = VK_IMAGE_LAYOUT_SHADER_READ_ONLY_OPTIMAL;
                local_528[uVar12 + 0x10] = (VkFormat)uVar19;
                uVar19 = (ulong)((VkFormat)uVar19 + VK_FORMAT_R4G4_UNORM_PACK8);
              }
              uVar12 = uVar12 + 1;
            } while (uVar18 != uVar12);
            local_4a8.attachmentCount = (uint32_t)uVar19;
          }
          local_458.pNext = (void *)0x0;
          local_458.flags = 0;
          local_458.pipelineBindPoint = VK_PIPELINE_BIND_POINT_GRAPHICS;
          local_458.pDepthStencilAttachment = (VkAttachmentReference2 *)0x0;
          local_458.preserveAttachmentCount = 0;
          local_458._76_4_ = 0;
          local_458.pColorAttachments = (VkAttachmentReference2 *)0x0;
          local_458.pResolveAttachments = (VkAttachmentReference2 *)0x0;
          local_458.pInputAttachments = (VkAttachmentReference2 *)0x0;
          local_458.colorAttachmentCount = 0;
          local_458._44_4_ = 0;
          local_458.pPreserveAttachments = (uint32_t *)0x0;
          local_458.sType = VK_STRUCTURE_TYPE_SUBPASS_DESCRIPTION_2;
          local_458._4_4_ = 0;
          local_458.inputAttachmentCount = 0;
          local_458.viewMask = ~(-1 << ((byte)local_53c & 0x1f));
          memset(local_138,0,0x100);
          memset(local_238,0,0x100);
          if (uVar2 != 0) {
            lVar13 = 0;
            do {
              (&local_138[0].sType)[lVar13 * 2] = VK_STRUCTURE_TYPE_ATTACHMENT_REFERENCE_2;
              if (*(int *)((long)local_528 + lVar13 + 0x20) == 0) {
                uVar14 = 0xffffffff;
                VVar16 = VK_IMAGE_LAYOUT_UNDEFINED;
              }
              else {
                uVar14 = *(uint32_t *)((long)local_528 + lVar13 + 0x60);
                VVar16 = VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL;
              }
              (&local_138[0].attachment)[lVar13 * 2] = uVar14;
              (&local_138[0].layout)[lVar13 * 2] = VVar16;
              lVar13 = lVar13 + 4;
            } while (uVar17 << 2 != lVar13);
          }
          if (uVar3 != 0) {
            lVar13 = 0;
            do {
              (&local_238[0].sType)[lVar13 * 2] = VK_STRUCTURE_TYPE_ATTACHMENT_REFERENCE_2;
              if (*(int *)((long)local_528 + lVar13) == 0) {
                uVar14 = 0xffffffff;
                VVar16 = VK_IMAGE_LAYOUT_UNDEFINED;
              }
              else {
                uVar14 = *(uint32_t *)((long)local_528 + lVar13 + 0x40);
                VVar16 = VK_IMAGE_LAYOUT_SHADER_READ_ONLY_OPTIMAL;
              }
              (&local_238[0].attachment)[lVar13 * 2] = uVar14;
              (&local_238[0].layout)[lVar13 * 2] = VVar16;
              lVar13 = lVar13 + 4;
            } while (uVar18 << 2 != lVar13);
          }
          local_4a8.pSubpasses = &local_458;
          local_458.colorAttachmentCount = uVar2;
          local_458.inputAttachmentCount = uVar3;
          local_4a8.subpassCount = 1;
          local_4a8.pAttachments = local_3f8;
          local_458.pInputAttachments = local_238;
          local_458.pColorAttachments = local_138;
          bVar6 = Fossilize::StateRecorder::record_render_pass2
                            (local_530,(VkRenderPass)&DAT_00000001,&local_4a8,0);
          return (VkRenderPass)(ulong)bVar6;
        }
        synthesize_render_pass();
      }
    }
  }
  else {
    synthesize_render_pass();
  }
  return (VkRenderPass)0x0;
}

Assistant:

static VkRenderPass synthesize_render_pass(StateRecorder &recorder, spvc_compiler frag,
                                           uint32_t view_count, uint8_t &active_rt_mask)
{
	if (!frag)
		return VK_NULL_HANDLE;

	spvc_resources resources;
	if (spvc_compiler_create_shader_resources(frag, &resources) != SPVC_SUCCESS)
	{
		LOGE("Failed to reflect resources.\n");
		return VK_NULL_HANDLE;
	}

	const spvc_reflected_resource *list;
	size_t count;

	VkFormat rt_formats[8] = {};
	VkFormat input_rt_formats[8] = {};
	unsigned num_rts = 0;
	unsigned num_input_rts = 0;

	if (spvc_resources_get_resource_list_for_type(resources, SPVC_RESOURCE_TYPE_STAGE_OUTPUT, &list, &count) != SPVC_SUCCESS)
		return VK_NULL_HANDLE;

	for (size_t i = 0; i < count; i++)
	{
		unsigned rt_count = 1;
		spvc_type rt_type = spvc_compiler_get_type_handle(frag, list[i].type_id);

		if (spvc_type_get_num_array_dimensions(rt_type) == 1)
		{
			if (!spvc_type_array_dimension_is_literal(rt_type, 0))
				return VK_NULL_HANDLE;
			rt_count = spvc_type_get_array_dimension(rt_type, 0);
		}

		uint32_t location = spvc_compiler_get_decoration(frag, list[i].id, SpvDecorationLocation);
		if (location + rt_count >= 8)
		{
			LOGE("RT index %u (array size %u) is out of range.\n", location, rt_count);
			return VK_NULL_HANDLE;
		}

		VkFormat base_format = VK_FORMAT_UNDEFINED;
		switch (spvc_type_get_basetype(rt_type))
		{
		case SPVC_BASETYPE_FP16:
		case SPVC_BASETYPE_FP32:
			base_format = VK_FORMAT_R8G8B8A8_UNORM;
			break;

		case SPVC_BASETYPE_INT16:
		case SPVC_BASETYPE_INT32:
			base_format = VK_FORMAT_R8G8B8A8_SINT;
			break;

		case SPVC_BASETYPE_UINT16:
		case SPVC_BASETYPE_UINT32:
			base_format = VK_FORMAT_R8G8B8A8_UINT;
			break;

		default:
			break;
		}

		for (unsigned j = 0; j < rt_count; j++)
		{
			rt_formats[location + j] = base_format;
			active_rt_mask |= 1u << (location + j);
		}
	}

	if (spvc_resources_get_resource_list_for_type(resources, SPVC_RESOURCE_TYPE_SUBPASS_INPUT, &list, &count) != SPVC_SUCCESS)
		return VK_NULL_HANDLE;

	for (size_t i = 0; i < count; i++)
	{
		unsigned rt_count = 1;
		spvc_type rt_type = spvc_compiler_get_type_handle(frag, list[i].type_id);

		if (spvc_type_get_num_array_dimensions(rt_type) == 1)
		{
			if (!spvc_type_array_dimension_is_literal(rt_type, 0))
				return VK_NULL_HANDLE;
			rt_count = spvc_type_get_array_dimension(rt_type, 0);
		}

		uint32_t location = spvc_compiler_get_decoration(frag, list[i].id, SpvDecorationInputAttachmentIndex);
		if (location + rt_count >= 8)
		{
			LOGE("Input attachment index %u (array size %u) is out of range.\n", location, rt_count);
			return VK_NULL_HANDLE;
		}

		VkFormat base_format = VK_FORMAT_UNDEFINED;
		switch (spvc_type_get_basetype(rt_type))
		{
		case SPVC_BASETYPE_FP16:
		case SPVC_BASETYPE_FP32:
			base_format = VK_FORMAT_R8G8B8A8_UNORM;
			break;

		case SPVC_BASETYPE_INT16:
		case SPVC_BASETYPE_INT32:
			base_format = VK_FORMAT_R8G8B8A8_SINT;
			break;

		case SPVC_BASETYPE_UINT16:
		case SPVC_BASETYPE_UINT32:
			base_format = VK_FORMAT_R8G8B8A8_UINT;
			break;

		default:
			break;
		}

		for (unsigned j = 0; j < rt_count; j++)
			input_rt_formats[location + j] = base_format;
	}

	for (unsigned i = 0; i < 8; i++)
		if (rt_formats[i] != VK_FORMAT_UNDEFINED)
			num_rts = i + 1;

	for (unsigned i = 0; i < 8; i++)
		if (input_rt_formats[i] != VK_FORMAT_UNDEFINED)
			num_input_rts = i + 1;

	if (num_rts + num_input_rts > 8)
	{
		LOGE("Number of total attachments exceeds 8.\n");
		return VK_NULL_HANDLE;
	}

	unsigned output_location_to_attachment[8] = {};
	unsigned input_location_to_attachment[8] = {};

	VkRenderPassCreateInfo2 info = { VK_STRUCTURE_TYPE_RENDER_PASS_CREATE_INFO_2 };
	VkAttachmentDescription2 attachments[8] = {};

	for (unsigned i = 0; i < num_rts; i++)
	{
		if (rt_formats[i] != VK_FORMAT_UNDEFINED)
		{
			auto &att = attachments[info.attachmentCount];
			att.sType = VK_STRUCTURE_TYPE_ATTACHMENT_DESCRIPTION_2;
			att.format = rt_formats[i];
			att.samples = VK_SAMPLE_COUNT_1_BIT;
			att.loadOp = VK_ATTACHMENT_LOAD_OP_CLEAR;
			att.storeOp = VK_ATTACHMENT_STORE_OP_STORE;
			att.initialLayout = VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL;
			att.finalLayout = VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL;
			output_location_to_attachment[i] = info.attachmentCount;
			info.attachmentCount++;
		}
	}

	for (unsigned i = 0; i < num_input_rts; i++)
	{
		if (input_rt_formats[i] != VK_FORMAT_UNDEFINED)
		{
			auto &att = attachments[info.attachmentCount];
			att.sType = VK_STRUCTURE_TYPE_ATTACHMENT_DESCRIPTION_2;
			att.format = input_rt_formats[i];
			att.samples = VK_SAMPLE_COUNT_1_BIT;
			att.loadOp = VK_ATTACHMENT_LOAD_OP_LOAD;
			att.storeOp = VK_ATTACHMENT_STORE_OP_STORE;
			att.initialLayout = VK_IMAGE_LAYOUT_SHADER_READ_ONLY_OPTIMAL;
			att.finalLayout = VK_IMAGE_LAYOUT_SHADER_READ_ONLY_OPTIMAL;
			input_location_to_attachment[i] = info.attachmentCount;
			info.attachmentCount++;
		}
	}

	VkSubpassDescription2 subpass = { VK_STRUCTURE_TYPE_SUBPASS_DESCRIPTION_2 };
	subpass.pipelineBindPoint = VK_PIPELINE_BIND_POINT_GRAPHICS;
	// view_count of 0 translates to default 0 mask.
	subpass.viewMask = (1u << view_count) - 1u;

	VkAttachmentReference2 references[8] = {};
	VkAttachmentReference2 input_references[8] = {};

	for (unsigned i = 0; i < num_rts; i++)
	{
		references[i].sType = VK_STRUCTURE_TYPE_ATTACHMENT_REFERENCE_2;
		if (rt_formats[i] != VK_FORMAT_UNDEFINED)
		{
			references[i].attachment = output_location_to_attachment[i];
			references[i].layout = VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL;
		}
		else
		{
			references[i].attachment = VK_ATTACHMENT_UNUSED;
			references[i].layout = VK_IMAGE_LAYOUT_UNDEFINED;
		}
	}

	for (unsigned i = 0; i < num_input_rts; i++)
	{
		input_references[i].sType = VK_STRUCTURE_TYPE_ATTACHMENT_REFERENCE_2;
		if (input_rt_formats[i] != VK_FORMAT_UNDEFINED)
		{
			input_references[i].attachment = input_location_to_attachment[i];
			input_references[i].layout = VK_IMAGE_LAYOUT_SHADER_READ_ONLY_OPTIMAL;
		}
		else
		{
			input_references[i].attachment = VK_ATTACHMENT_UNUSED;
			input_references[i].layout = VK_IMAGE_LAYOUT_UNDEFINED;
		}
	}

	subpass.colorAttachmentCount = num_rts;
	subpass.pColorAttachments = references;
	subpass.inputAttachmentCount = num_input_rts;
	subpass.pInputAttachments = input_references;

	info.subpassCount = 1;
	info.pSubpasses = &subpass;
	info.pAttachments = attachments;

	if (!recorder.record_render_pass2((VkRenderPass)uint64_t(1), info))
		return VK_NULL_HANDLE;

	return (VkRenderPass)uint64_t(1);
}